

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereTriangleDetector.cpp
# Opt level: O3

bool __thiscall
SphereTriangleDetector::collide
          (SphereTriangleDetector *this,btVector3 *sphereCenter,btVector3 *point,
          btVector3 *resultNormal,btScalar *depth,btScalar *timeOfImpact,
          btScalar contactBreakingThreshold)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btTriangleShape *pbVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  btScalar bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  btVector3 lp;
  btVector3 pa;
  btVector3 pb;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  btVector3 local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  btVector3 local_50;
  btVector3 local_40;
  
  pbVar3 = this->m_triangle;
  fVar20 = (this->m_sphere->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[0] *
           *(float *)&(this->m_sphere->super_btConvexInternalShape).super_btConvexShape.
                      super_btCollisionShape.field_0x1c;
  fVar9 = contactBreakingThreshold + fVar20;
  fVar22 = pbVar3->m_vertices1[0].m_floats[0];
  fVar13 = pbVar3->m_vertices1[1].m_floats[0] - fVar22;
  uVar1 = *(undefined8 *)(pbVar3->m_vertices1[1].m_floats + 1);
  uVar2 = *(undefined8 *)(pbVar3->m_vertices1[0].m_floats + 1);
  fVar17 = (float)uVar2;
  fVar11 = (float)uVar1 - fVar17;
  fVar18 = (float)((ulong)uVar2 >> 0x20);
  fVar12 = (float)((ulong)uVar1 >> 0x20) - fVar18;
  fVar21 = pbVar3->m_vertices1[2].m_floats[1] - fVar17;
  _local_98 = *(undefined8 *)sphereCenter->m_floats;
  bVar10 = SUB84(_local_98,4);
  fVar19 = (float)_local_98;
  fVar15 = pbVar3->m_vertices1[2].m_floats[2] - fVar18;
  fVar16 = pbVar3->m_vertices1[2].m_floats[0] - fVar22;
  fVar14 = fVar11 * fVar15 - fVar21 * fVar12;
  fVar12 = fVar12 * fVar16 - fVar15 * fVar13;
  fVar15 = fVar21 * fVar13 - fVar16 * fVar11;
  fVar13 = 1.0 / SQRT(fVar15 * fVar15 + fVar14 * fVar14 + fVar12 * fVar12);
  fVar15 = fVar15 * fVar13;
  fVar14 = fVar13 * fVar14;
  fVar13 = fVar13 * fVar12;
  fVar11 = sphereCenter->m_floats[2];
  fVar22 = (fVar11 - fVar18) * fVar15 + (fVar19 - fVar22) * fVar14 + (bVar10 - fVar17) * fVar13;
  if (fVar22 < 0.0) {
    fVar22 = -fVar22;
    fVar14 = -fVar14;
    fVar13 = -fVar13;
    fVar15 = -fVar15;
  }
  if (fVar9 <= fVar22) {
    return false;
  }
  local_a8 = ZEXT416((uint)fVar11);
  local_68 = ZEXT416((uint)fVar20);
  local_88.m_floats._0_8_ = *(undefined8 *)sphereCenter->m_floats;
  local_88.m_floats._8_8_ = *(undefined8 *)(sphereCenter->m_floats + 2);
  local_78._4_4_ = fVar13;
  local_78._0_4_ = fVar14;
  local_78._8_4_ = fVar15;
  local_78._12_4_ = 0;
  local_50.m_floats[1] = fVar13;
  local_50.m_floats[0] = fVar14;
  local_50.m_floats[2] = fVar15;
  local_50.m_floats[3] = 0.0;
  bVar5 = pointInTriangle(this,pbVar3->m_vertices1,&local_50,&local_88);
  if (bVar5) {
    local_98 = fVar19 - fVar22 * fVar14;
    fStack_94 = bVar10 - fVar22 * fVar13;
    local_a8._0_4_ = fVar11 - fVar15 * fVar22;
    local_a8._4_4_ = 0.0;
  }
  else {
    iVar6 = (*(pbVar3->super_btPolyhedralConvexShape).super_btConvexInternalShape.
              super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x19])(pbVar3);
    if (iVar6 < 1) {
      return false;
    }
    bVar5 = false;
    uVar8 = 0;
    do {
      (*(this->m_triangle->super_btPolyhedralConvexShape).super_btConvexInternalShape.
        super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x1a])
                (this->m_triangle,uVar8,&local_50,&local_40);
      bVar10 = SegmentSqrDistance(&local_50,&local_40,sphereCenter,&local_88);
      if (bVar10 < fVar9 * fVar9) {
        local_98 = local_88.m_floats[0];
        fStack_94 = local_88.m_floats[1];
        local_a8._8_8_ = 0;
        local_a8._0_4_ = local_88.m_floats[2];
        local_a8._4_4_ = local_88.m_floats[3];
      }
      bVar5 = (bool)(bVar5 | bVar10 < fVar9 * fVar9);
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
      iVar6 = (*(this->m_triangle->super_btPolyhedralConvexShape).super_btConvexInternalShape.
                super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x19])();
    } while ((int)uVar7 < iVar6);
    if (!bVar5) {
      return false;
    }
    fVar19 = sphereCenter->m_floats[0];
    bVar10 = sphereCenter->m_floats[1];
    fVar11 = sphereCenter->m_floats[2];
  }
  fVar19 = fVar19 - local_98;
  fVar12 = bVar10 - fStack_94;
  fVar11 = fVar11 - (float)local_a8._0_4_;
  fVar22 = fVar19 * fVar19 + fVar12 * fVar12 + fVar11 * fVar11;
  if (fVar9 * fVar9 <= fVar22) {
    return false;
  }
  if (fVar22 <= 1.1920929e-07) {
    *(undefined8 *)resultNormal->m_floats = local_78._0_8_;
    *(undefined8 *)(resultNormal->m_floats + 2) = local_78._8_8_;
  }
  else {
    fVar9 = 1.0 / SQRT(fVar11 * fVar11 + fVar19 * fVar19 + fVar12 * fVar12);
    auVar4._4_4_ = fVar9 * fVar12;
    auVar4._0_4_ = fVar9 * fVar19;
    auVar4._8_4_ = fVar11;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])resultNormal->m_floats = auVar4;
    resultNormal->m_floats[2] = fVar11 * fVar9;
    local_68._0_4_ = (float)local_68._0_4_ - SQRT(fVar22);
  }
  point->m_floats[0] = local_98;
  point->m_floats[1] = fStack_94;
  point->m_floats[2] = (btScalar)local_a8._0_4_;
  point->m_floats[3] = (btScalar)local_a8._4_4_;
  *depth = -(float)local_68._0_4_;
  return true;
}

Assistant:

bool SphereTriangleDetector::collide(const btVector3& sphereCenter,btVector3 &point, btVector3& resultNormal, btScalar& depth, btScalar &timeOfImpact, btScalar contactBreakingThreshold)
{

	const btVector3* vertices = &m_triangle->getVertexPtr(0);
	
	btScalar radius = m_sphere->getRadius();
	btScalar radiusWithThreshold = radius + contactBreakingThreshold;

	btVector3 normal = (vertices[1]-vertices[0]).cross(vertices[2]-vertices[0]);
	normal.normalize();
	btVector3 p1ToCentre = sphereCenter - vertices[0];
	btScalar distanceFromPlane = p1ToCentre.dot(normal);

	if (distanceFromPlane < btScalar(0.))
	{
		//triangle facing the other way
		distanceFromPlane *= btScalar(-1.);
		normal *= btScalar(-1.);
	}

	bool isInsideContactPlane = distanceFromPlane < radiusWithThreshold;
	
	// Check for contact / intersection
	bool hasContact = false;
	btVector3 contactPoint;
	if (isInsideContactPlane) {
		if (facecontains(sphereCenter,vertices,normal)) {
			// Inside the contact wedge - touches a point on the shell plane
			hasContact = true;
			contactPoint = sphereCenter - normal*distanceFromPlane;
		} else {
			// Could be inside one of the contact capsules
			btScalar contactCapsuleRadiusSqr = radiusWithThreshold*radiusWithThreshold;
			btVector3 nearestOnEdge;
			for (int i = 0; i < m_triangle->getNumEdges(); i++) {
				
				btVector3 pa;
				btVector3 pb;
				
				m_triangle->getEdge(i,pa,pb);

				btScalar distanceSqr = SegmentSqrDistance(pa,pb,sphereCenter, nearestOnEdge);
				if (distanceSqr < contactCapsuleRadiusSqr) {
					// Yep, we're inside a capsule
					hasContact = true;
					contactPoint = nearestOnEdge;
				}
				
			}
		}
	}

	if (hasContact) {
		btVector3 contactToCentre = sphereCenter - contactPoint;
		btScalar distanceSqr = contactToCentre.length2();

		if (distanceSqr < radiusWithThreshold*radiusWithThreshold)
		{
			if (distanceSqr>SIMD_EPSILON)
			{
				btScalar distance = btSqrt(distanceSqr);
				resultNormal = contactToCentre;
				resultNormal.normalize();
				point = contactPoint;
				depth = -(radius-distance);
			} else
			{
				resultNormal = normal;
				point = contactPoint;
				depth = -radius;
			}
			return true;
		}
	}
	
	return false;
}